

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprite.cpp
# Opt level: O3

uint8_t __thiscall Sprite::get_pixel(Sprite *this,uint8_t tile_id,uint8_t x,uint8_t y)

{
  pointer puVar1;
  byte bVar2;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  ulong uVar3;
  undefined7 in_register_00000031;
  ulong uVar4;
  
  uVar4 = (ulong)((uint)((int)CONCAT71(in_register_00000031,tile_id) * 0x40 +
                         (int)CONCAT71(in_register_00000011,x) +
                        (int)CONCAT71(in_register_00000009,y) * 8) >> 1);
  puVar1 = (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (long)(this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
  if ((x & 1) == 0) {
    if (uVar3 <= uVar4) {
LAB_001c255c:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    bVar2 = puVar1[uVar4] >> 4;
  }
  else {
    if (uVar3 <= uVar4) goto LAB_001c255c;
    bVar2 = puVar1[uVar4] & 0xf;
  }
  return bVar2;
}

Assistant:

uint8_t Sprite::get_pixel(uint8_t tile_id, uint8_t x, uint8_t y)
{
    size_t pixel_index = ((tile_id * 64) + (y*8) + x);
    size_t byte_index = pixel_index / 2;
    bool lsb = pixel_index % 2;

    if(lsb)
        return _data.at(byte_index) & 0x0F;
    else
        return (_data.at(byte_index) & 0xF0) >> 4;
}